

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_lockbitmap.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  char cVar10;
  long lVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  long lVar14;
  long *plVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  char *pcVar20;
  uint uVar21;
  bool bVar22;
  bool bVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  undefined4 uVar26;
  char cVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  ALLEGRO_EVENT event;
  int local_b8;
  int local_78;
  int local_58;
  uint local_54;
  int local_38;
  int iVar31;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar43;
  int iVar44;
  int iVar45;
  
  cVar10 = al_install_system(0x85020700,atexit);
  if (cVar10 == '\0') goto LAB_00102c4d;
  al_install_keyboard();
  al_install_mouse();
  al_install_touch_input();
  lVar11 = al_create_display(0x300,0x100);
  if (lVar11 == 0) {
    pcVar20 = "Error creating display\n";
LAB_00102c46:
    do {
      abort_example(pcVar20);
LAB_00102c4d:
      pcVar20 = "Could not init Allegro.\n";
    } while( true );
  }
  uVar12 = al_create_event_queue();
  uVar13 = al_get_keyboard_event_source();
  al_register_event_source(uVar12,uVar13);
  uVar13 = al_get_mouse_event_source();
  al_register_event_source(uVar12,uVar13);
  cVar10 = al_is_touch_input_installed();
  if (cVar10 != '\0') {
    uVar13 = al_get_touch_input_mouse_emulation_event_source();
    al_register_event_source(uVar12,uVar13);
  }
  log_printf("Press space to change bitmap type\n");
  log_printf("Press w to toggle WRITEONLY mode\n");
  uVar21 = 2;
  local_b8 = 0;
  cVar10 = '\0';
LAB_001024f8:
  bVar22 = true;
  do {
    pcVar20 = " in write-only mode\n";
    if (uVar21 == 0) {
      pcVar20 = " in read/write mode\n";
    }
    if (bVar22) {
      if (cVar10 == '\x01') {
        log_printf("Locking memory bitmap");
        al_map_rgb(0,0,0);
        al_clear_to_color();
        uVar13 = 1;
LAB_00102578:
        al_set_new_bitmap_flags(uVar13);
        lVar14 = al_create_bitmap(0x300,0x100);
      }
      else {
        if (cVar10 == '\0') {
          log_printf("Locking video bitmap");
          al_map_rgb(0,0,0);
          al_clear_to_color();
          uVar13 = 0x400;
          goto LAB_00102578;
        }
        log_printf("Locking display backbuffer");
        lVar14 = al_get_backbuffer(lVar11);
      }
      if (lVar14 == 0) {
        pcVar20 = "Error creating bitmap";
        goto LAB_00102c46;
      }
      log_printf(pcVar20);
      al_set_target_bitmap(lVar14);
      al_map_rgb_f(0x3f4ccccd,0x3f4ccccd,0x3f666666);
      al_clear_to_color();
      al_set_target_backbuffer(lVar11);
      plVar15 = (long *)al_lock_bitmap_region(lVar14,0xc1,0x41,0x17d,0x7f,0xd,uVar21);
      if (plVar15 != (long *)0x0) {
        auVar25 = ZEXT116(uVar21 == 0);
        auVar25 = pshuflw(auVar25,auVar25,0);
        uVar24 = auVar25._0_4_;
        iVar1 = *(int *)((long)plVar15 + 0xc);
        lVar16 = *plVar15 + 0xe;
        uVar18 = 0;
        do {
          iVar17 = (int)uVar18;
          cVar27 = (char)uVar18 * '\x02';
          auVar25 = ZEXT116(uVar18 == 0x7e || uVar18 == 0);
          auVar25 = pshuflw(auVar25,auVar25,0);
          uVar26 = auVar25._0_4_;
          auVar25 = ZEXT216(CONCAT11(cVar27,cVar27));
          auVar28 = pshuflw(auVar25,auVar25,0);
          auVar25 = ZEXT116((byte)((uVar18 & 0xffffffff) >> 2) & 0x3f);
          auVar25 = pshuflw(auVar25,auVar25,0);
          auVar29._0_4_ = auVar25._0_4_;
          auVar29._4_4_ = auVar29._0_4_;
          auVar29._8_4_ = auVar29._0_4_;
          auVar29._12_4_ = auVar29._0_4_;
          auVar29 = psllw(auVar29,0xb);
          lVar19 = 0;
          auVar25 = _DAT_00103020;
          auVar63 = _DAT_00103010;
          do {
            auVar46._8_4_ = (int)lVar19;
            auVar46._0_8_ = lVar19;
            auVar46._12_4_ = (int)((ulong)lVar19 >> 0x20);
            auVar47 = (auVar46 | _DAT_00103060) ^ _DAT_00103070;
            auVar57._0_4_ = -(uint)(auVar47._0_4_ < -0x7ffffe83);
            auVar57._4_4_ = -(uint)(auVar47._0_4_ < -0x7ffffe83);
            auVar57._8_4_ = -(uint)(auVar47._8_4_ < -0x7ffffe83);
            auVar57._12_4_ = -(uint)(auVar47._8_4_ < -0x7ffffe83);
            auVar54._0_4_ = -(uint)(auVar47._4_4_ == -0x80000000);
            auVar54._4_4_ = -(uint)(auVar47._4_4_ == -0x80000000);
            auVar54._8_4_ = -(uint)(auVar47._12_4_ == -0x80000000);
            auVar54._12_4_ = -(uint)(auVar47._12_4_ == -0x80000000);
            auVar47 = (auVar46 | _DAT_00103050) ^ _DAT_00103070;
            auVar62._0_4_ = -(uint)(auVar47._0_4_ < -0x7ffffe83);
            auVar62._4_4_ = -(uint)(auVar47._0_4_ < -0x7ffffe83);
            auVar62._8_4_ = -(uint)(auVar47._8_4_ < -0x7ffffe83);
            auVar62._12_4_ = -(uint)(auVar47._8_4_ < -0x7ffffe83);
            auVar49._0_4_ = -(uint)(auVar47._4_4_ == -0x80000000);
            auVar49._4_4_ = -(uint)(auVar47._4_4_ == -0x80000000);
            auVar49._8_4_ = -(uint)(auVar47._12_4_ == -0x80000000);
            auVar49._12_4_ = -(uint)(auVar47._12_4_ == -0x80000000);
            auVar50 = packssdw(auVar49 & auVar62,auVar54 & auVar57);
            auVar47 = (auVar46 | _DAT_00103040) ^ _DAT_00103070;
            auVar58._0_4_ = -(uint)(auVar47._0_4_ < -0x7ffffe83);
            auVar58._4_4_ = -(uint)(auVar47._0_4_ < -0x7ffffe83);
            auVar58._8_4_ = -(uint)(auVar47._8_4_ < -0x7ffffe83);
            auVar58._12_4_ = -(uint)(auVar47._8_4_ < -0x7ffffe83);
            auVar38._0_4_ = -(uint)(auVar47._4_4_ == -0x80000000);
            auVar38._4_4_ = -(uint)(auVar47._4_4_ == -0x80000000);
            auVar38._8_4_ = -(uint)(auVar47._12_4_ == -0x80000000);
            auVar38._12_4_ = -(uint)(auVar47._12_4_ == -0x80000000);
            auVar47 = (auVar46 | _DAT_00103030) ^ _DAT_00103070;
            auVar60._0_4_ = -(uint)(auVar47._0_4_ < -0x7ffffe83);
            auVar60._4_4_ = -(uint)(auVar47._0_4_ < -0x7ffffe83);
            auVar60._8_4_ = -(uint)(auVar47._8_4_ < -0x7ffffe83);
            auVar60._12_4_ = -(uint)(auVar47._8_4_ < -0x7ffffe83);
            auVar30._0_4_ = -(uint)(auVar47._4_4_ == -0x80000000);
            auVar30._4_4_ = -(uint)(auVar47._4_4_ == -0x80000000);
            auVar30._8_4_ = -(uint)(auVar47._12_4_ == -0x80000000);
            auVar30._12_4_ = -(uint)(auVar47._12_4_ == -0x80000000);
            auVar47 = packssdw(auVar30 & auVar60,auVar38 & auVar58);
            auVar30 = packssdw(auVar47,auVar50);
            iVar31 = auVar25._0_4_;
            auVar32._0_4_ = -(uint)(iVar31 == 0);
            iVar34 = auVar25._4_4_;
            auVar32._4_4_ = -(uint)(iVar34 == 0);
            iVar35 = auVar25._8_4_;
            iVar36 = auVar25._12_4_;
            auVar32._8_4_ = -(uint)(iVar35 == 0);
            auVar32._12_4_ = -(uint)(iVar36 == 0);
            iVar37 = auVar63._0_4_;
            auVar39._0_4_ = -(uint)(iVar37 == 0);
            iVar43 = auVar63._4_4_;
            auVar39._4_4_ = -(uint)(iVar43 == 0);
            iVar44 = auVar63._8_4_;
            iVar45 = auVar63._12_4_;
            auVar39._8_4_ = -(uint)(iVar44 == 0);
            auVar39._12_4_ = -(uint)(iVar45 == 0);
            auVar47 = packssdw(auVar32,auVar39);
            auVar52._4_4_ = uVar26;
            auVar52._0_4_ = uVar26;
            auVar52._8_4_ = uVar26;
            auVar52._12_4_ = uVar26;
            auVar59._0_4_ = -(uint)(iVar31 == 0x17c);
            auVar59._4_4_ = -(uint)(iVar34 == 0x17c);
            auVar59._8_4_ = -(uint)(iVar35 == 0x17c);
            auVar59._12_4_ = -(uint)(iVar36 == 0x17c);
            auVar40._0_4_ = -(uint)(iVar37 == 0x17c);
            auVar40._4_4_ = -(uint)(iVar43 == 0x17c);
            auVar40._8_4_ = -(uint)(iVar44 == 0x17c);
            auVar40._12_4_ = -(uint)(iVar45 == 0x17c);
            auVar50 = packssdw(auVar59,auVar40);
            auVar60 = ~(auVar50 | auVar47 | auVar52) & auVar30;
            auVar25 = auVar25 ^ _DAT_00103070;
            auVar51._0_4_ = -(uint)(auVar25._0_4_ < -0x7fffff81);
            auVar51._4_4_ = -(uint)(auVar25._4_4_ < -0x7fffff81);
            auVar51._8_4_ = -(uint)(auVar25._8_4_ < -0x7fffff81);
            auVar51._12_4_ = -(uint)(auVar25._12_4_ < -0x7fffff81);
            auVar63 = auVar63 ^ _DAT_00103070;
            auVar33._0_4_ = -(uint)(auVar63._0_4_ < -0x7fffff81);
            auVar33._4_4_ = -(uint)(auVar63._4_4_ < -0x7fffff81);
            auVar33._8_4_ = -(uint)(auVar63._8_4_ < -0x7fffff81);
            auVar33._12_4_ = -(uint)(auVar63._12_4_ < -0x7fffff81);
            auVar52 = packssdw(auVar51,auVar33);
            auVar47 = ~auVar52 & auVar60;
            auVar50 = auVar47 & _DAT_001030b0;
            sVar2 = auVar50._0_2_;
            sVar3 = auVar50._2_2_;
            auVar41[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar50[2] - (0xff < sVar3);
            auVar41[0] = (0 < sVar2) * (sVar2 < 0x100) * auVar50[0] - (0xff < sVar2);
            sVar4 = auVar50._4_2_;
            auVar41[2] = (0 < sVar4) * (sVar4 < 0x100) * auVar50[4] - (0xff < sVar4);
            sVar5 = auVar50._6_2_;
            auVar41[3] = (0 < sVar5) * (sVar5 < 0x100) * auVar50[6] - (0xff < sVar5);
            sVar6 = auVar50._8_2_;
            auVar41[4] = (0 < sVar6) * (sVar6 < 0x100) * auVar50[8] - (0xff < sVar6);
            sVar7 = auVar50._10_2_;
            auVar41[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar50[10] - (0xff < sVar7);
            sVar8 = auVar50._12_2_;
            auVar41[6] = (0 < sVar8) * (sVar8 < 0x100) * auVar50[0xc] - (0xff < sVar8);
            sVar9 = auVar50._14_2_;
            auVar41[7] = (0 < sVar9) * (sVar9 < 0x100) * auVar50[0xe] - (0xff < sVar9);
            auVar41[8] = (0 < sVar2) * (sVar2 < 0x100) * auVar50[0] - (0xff < sVar2);
            auVar41[9] = (0 < sVar3) * (sVar3 < 0x100) * auVar50[2] - (0xff < sVar3);
            auVar41[10] = (0 < sVar4) * (sVar4 < 0x100) * auVar50[4] - (0xff < sVar4);
            auVar41[0xb] = (0 < sVar5) * (sVar5 < 0x100) * auVar50[6] - (0xff < sVar5);
            auVar41[0xc] = (0 < sVar6) * (sVar6 < 0x100) * auVar50[8] - (0xff < sVar6);
            auVar41[0xd] = (0 < sVar7) * (sVar7 < 0x100) * auVar50[10] - (0xff < sVar7);
            auVar41[0xe] = (0 < sVar8) * (sVar8 < 0x100) * auVar50[0xc] - (0xff < sVar8);
            auVar41[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar50[0xe] - (0xff < sVar9);
            auVar50 = psllw(auVar41,7);
            auVar50 = auVar50 & _DAT_001030c0;
            auVar55[0] = -(auVar50[0] < '\0');
            auVar55[1] = -(auVar50[1] < '\0');
            auVar55[2] = -(auVar50[2] < '\0');
            auVar55[3] = -(auVar50[3] < '\0');
            auVar55[4] = -(auVar50[4] < '\0');
            auVar55[5] = -(auVar50[5] < '\0');
            auVar55[6] = -(auVar50[6] < '\0');
            auVar55[7] = -(auVar50[7] < '\0');
            auVar55[8] = -(auVar50[8] < '\0');
            auVar55[9] = -(auVar50[9] < '\0');
            auVar55[10] = -(auVar50[10] < '\0');
            auVar55[0xb] = -(auVar50[0xb] < '\0');
            auVar55[0xc] = -(auVar50[0xc] < '\0');
            auVar55[0xd] = -(auVar50[0xd] < '\0');
            auVar55[0xe] = -(auVar50[0xe] < '\0');
            auVar55[0xf] = -(auVar50[0xf] < '\0');
            auVar47 = psllw(auVar47,0xf);
            auVar47 = psraw(auVar47,0xf);
            auVar42._0_4_ = -(uint)(auVar25._0_4_ < -0x7fffff02);
            auVar42._4_4_ = -(uint)(auVar25._4_4_ < -0x7fffff02);
            auVar42._8_4_ = -(uint)(auVar25._8_4_ < -0x7fffff02);
            auVar42._12_4_ = -(uint)(auVar25._12_4_ < -0x7fffff02);
            auVar48._0_4_ = -(uint)(auVar63._0_4_ < -0x7fffff02);
            auVar48._4_4_ = -(uint)(auVar63._4_4_ < -0x7fffff02);
            auVar48._8_4_ = -(uint)(auVar63._8_4_ < -0x7fffff02);
            auVar48._12_4_ = -(uint)(auVar63._12_4_ < -0x7fffff02);
            auVar25 = packssdw(auVar42,auVar48);
            auVar63 = packsswb(auVar25,auVar25);
            auVar52 = auVar52 & auVar60;
            auVar25 = auVar52 & _DAT_001030b0;
            sVar2 = auVar25._0_2_;
            sVar3 = auVar25._2_2_;
            auVar61[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar25[2] - (0xff < sVar3);
            auVar61[0] = (0 < sVar2) * (sVar2 < 0x100) * auVar25[0] - (0xff < sVar2);
            sVar4 = auVar25._4_2_;
            auVar61[2] = (0 < sVar4) * (sVar4 < 0x100) * auVar25[4] - (0xff < sVar4);
            sVar5 = auVar25._6_2_;
            auVar61[3] = (0 < sVar5) * (sVar5 < 0x100) * auVar25[6] - (0xff < sVar5);
            sVar6 = auVar25._8_2_;
            auVar61[4] = (0 < sVar6) * (sVar6 < 0x100) * auVar25[8] - (0xff < sVar6);
            sVar7 = auVar25._10_2_;
            auVar61[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar25[10] - (0xff < sVar7);
            sVar8 = auVar25._12_2_;
            auVar61[6] = (0 < sVar8) * (sVar8 < 0x100) * auVar25[0xc] - (0xff < sVar8);
            sVar9 = auVar25._14_2_;
            auVar61[7] = (0 < sVar9) * (sVar9 < 0x100) * auVar25[0xe] - (0xff < sVar9);
            auVar61[8] = (0 < sVar2) * (sVar2 < 0x100) * auVar25[0] - (0xff < sVar2);
            auVar61[9] = (0 < sVar3) * (sVar3 < 0x100) * auVar25[2] - (0xff < sVar3);
            auVar61[10] = (0 < sVar4) * (sVar4 < 0x100) * auVar25[4] - (0xff < sVar4);
            auVar61[0xb] = (0 < sVar5) * (sVar5 < 0x100) * auVar25[6] - (0xff < sVar5);
            auVar61[0xc] = (0 < sVar6) * (sVar6 < 0x100) * auVar25[8] - (0xff < sVar6);
            auVar61[0xd] = (0 < sVar7) * (sVar7 < 0x100) * auVar25[10] - (0xff < sVar7);
            auVar61[0xe] = (0 < sVar8) * (sVar8 < 0x100) * auVar25[0xc] - (0xff < sVar8);
            auVar61[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar25[0xe] - (0xff < sVar9);
            auVar25 = psllw(auVar61,7);
            auVar25 = auVar25 & _DAT_001030c0;
            auVar64[0] = -(auVar25[0] < '\0');
            auVar64[1] = -(auVar25[1] < '\0');
            auVar64[2] = -(auVar25[2] < '\0');
            auVar64[3] = -(auVar25[3] < '\0');
            auVar64[4] = -(auVar25[4] < '\0');
            auVar64[5] = -(auVar25[5] < '\0');
            auVar64[6] = -(auVar25[6] < '\0');
            auVar64[7] = -(auVar25[7] < '\0');
            auVar64[8] = -(auVar25[8] < '\0');
            auVar64[9] = -(auVar25[9] < '\0');
            auVar64[10] = -(auVar25[10] < '\0');
            auVar64[0xb] = -(auVar25[0xb] < '\0');
            auVar64[0xc] = -(auVar25[0xc] < '\0');
            auVar64[0xd] = -(auVar25[0xd] < '\0');
            auVar64[0xe] = -(auVar25[0xe] < '\0');
            auVar64[0xf] = -(auVar25[0xf] < '\0');
            auVar25 = psllw(auVar52,0xf);
            auVar25 = psraw(auVar25,0xf);
            auVar25 = ~auVar47 & auVar25 & _DAT_001030e0 | auVar29 & auVar47;
            auVar52 = ~auVar55 & auVar64 & auVar28;
            auVar48 = (auVar63 | auVar28) & auVar55 | auVar52;
            auVar52 = (auVar63 ^ _DAT_00103100 | auVar28 & auVar63) & auVar55 | auVar52;
            auVar56._0_4_ = (iVar31 + iVar17) * 0x10000 >> 0x10;
            auVar56._4_4_ = (iVar34 + iVar17) * 0x10000 >> 0x10;
            auVar56._8_4_ = (iVar35 + iVar17) * 0x10000 >> 0x10;
            auVar56._12_4_ = (iVar36 + iVar17) * 0x10000 >> 0x10;
            auVar53._0_4_ = (iVar37 + iVar17) * 0x10000 >> 0x10;
            auVar53._4_4_ = (iVar43 + iVar17) * 0x10000 >> 0x10;
            auVar53._8_4_ = (iVar44 + iVar17) * 0x10000 >> 0x10;
            auVar53._12_4_ = (iVar45 + iVar17) * 0x10000 >> 0x10;
            auVar63 = packssdw(auVar56,auVar53);
            auVar50._4_4_ = uVar24;
            auVar50._0_4_ = uVar24;
            auVar50._8_4_ = uVar24;
            auVar50._12_4_ = uVar24;
            auVar47._8_4_ = uVar24 ^ 0xffffffff;
            auVar47._0_8_ = CONCAT44(uVar24,uVar24) ^ 0xffffffffffffffff;
            auVar47._12_4_ = uVar24 ^ 0xffffffff;
            auVar30 = auVar30 & (auVar47 | auVar63 & auVar50);
            if ((auVar30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(ushort *)(lVar16 + -0xe + lVar19 * 2) =
                   auVar25._0_2_ | (ushort)(byte)(auVar52[0] >> 3) |
                   (ushort)(byte)(auVar48[0] >> 2) << 5;
            }
            if ((auVar30._0_4_ >> 0x10 & 1) != 0) {
              *(ushort *)(lVar16 + -0xc + lVar19 * 2) =
                   auVar25._2_2_ |
                   (ushort)(auVar48._0_4_ >> 5) & 0x7e0 | (ushort)(auVar52._0_4_ >> 0xb) & 0x1f;
            }
            if ((auVar30 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(ushort *)(lVar16 + -10 + lVar19 * 2) =
                   auVar25._4_2_ |
                   (ushort)(auVar48._0_4_ >> 0xd) & 0x7e0 | auVar52._2_2_ >> 3 & 0x1f;
            }
            if ((auVar30 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(ushort *)(lVar16 + -8 + lVar19 * 2) =
                   auVar25._6_2_ | auVar48._2_2_ >> 5 & 0xffe0 | auVar52._2_2_ >> 0xb;
            }
            if ((auVar30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(ushort *)(lVar16 + -6 + lVar19 * 2) =
                   auVar25._8_2_ | (ushort)((byte)(auVar52._4_2_ >> 3) & 0x1f) |
                   (ushort)((byte)(auVar48._4_2_ >> 2) & 0x3f) << 5;
            }
            if ((auVar30 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(ushort *)(lVar16 + -4 + lVar19 * 2) =
                   auVar25._10_2_ | auVar48._4_2_ >> 5 & 0xffe0 | auVar52._4_2_ >> 0xb;
            }
            if ((auVar30 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(ushort *)(lVar16 + -2 + lVar19 * 2) =
                   auVar25._12_2_ | (ushort)((byte)(auVar52._6_2_ >> 3) & 0x1f) |
                   (ushort)((byte)(auVar48._6_2_ >> 2) & 0x3f) << 5;
            }
            if ((auVar30 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(ushort *)(lVar16 + lVar19 * 2) =
                   auVar25._14_2_ | auVar48._6_2_ >> 5 & 0xffe0 | auVar52._6_2_ >> 0xb;
            }
            lVar19 = lVar19 + 8;
            auVar25._0_4_ = iVar31 + (int)DAT_001030f0;
            auVar25._4_4_ = iVar34 + DAT_001030f0._4_4_;
            auVar25._8_4_ = iVar35 + DAT_001030f0._8_4_;
            auVar25._12_4_ = iVar36 + DAT_001030f0._12_4_;
            auVar63._0_4_ = iVar37 + (int)DAT_001030f0;
            auVar63._4_4_ = iVar43 + DAT_001030f0._4_4_;
            auVar63._8_4_ = iVar44 + DAT_001030f0._8_4_;
            auVar63._12_4_ = iVar45 + DAT_001030f0._12_4_;
          } while (lVar19 != 0x180);
          uVar18 = uVar18 + 1;
          lVar16 = lVar16 + iVar1;
        } while (uVar18 != 0x7f);
        al_unlock_bitmap(lVar14);
      }
      if (cVar10 != '\x02') {
        al_draw_bitmap(0,0,lVar14,0);
        al_destroy_bitmap(lVar14);
      }
      al_flip_display();
    }
    while (al_wait_for_event(uVar12), local_78 != 0xb) {
      if ((local_78 == 0x15) && (local_38 == 1)) {
        uVar18 = al_get_display_width(lVar11);
        if (local_58 < (int)(((uint)(uVar18 >> 0x1f) & 1) + (int)uVar18) >> 1) goto LAB_00102c0a;
        uVar21 = uVar21 ^ 2;
        goto LAB_001024f8;
      }
    }
    if (local_58 == 0x3b) {
      return 0;
    }
    if (local_54 == 0x20) break;
    bVar22 = (local_54 & 0xffffffdf) == 0x57;
    if (bVar22) {
      uVar21 = uVar21 ^ 2;
    }
  } while( true );
LAB_00102c0a:
  bVar22 = local_b8 == 1;
  local_b8 = (uint)bVar22 * 2;
  bVar23 = cVar10 == '\0';
  cVar10 = bVar22 * '\x02';
  if (bVar23) {
    local_b8 = 1;
    cVar10 = '\x01';
  }
  goto LAB_001024f8;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_EVENT_QUEUE *events;
   ALLEGRO_EVENT event;
   enum Mode mode = MODE_VIDEO;
   int lock_flags = ALLEGRO_LOCK_WRITEONLY;
   bool redraw = true;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_install_keyboard();
   al_install_mouse();
   al_install_touch_input();

   open_log();

   /* Create a window. */
   display = al_create_display(3*256, 256);
   if (!display) {
      abort_example("Error creating display\n");
   }

   events = al_create_event_queue();
   al_register_event_source(events, al_get_keyboard_event_source());
   al_register_event_source(events, al_get_mouse_event_source());
   if (al_is_touch_input_installed()) {
      al_register_event_source(events,
         al_get_touch_input_mouse_emulation_event_source());
   }

   log_printf("Press space to change bitmap type\n");
   log_printf("Press w to toggle WRITEONLY mode\n");

   for (;;) {
      if (redraw) {
         draw(display, mode, lock_flags);
         redraw = false;
      }

      al_wait_for_event(events, &event);
      if (event.type == ALLEGRO_EVENT_KEY_CHAR) {
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
            break;
         if (event.keyboard.unichar == ' ') {
            mode = cycle_mode(mode);
            redraw = true;
         }
         else if (event.keyboard.unichar == 'w' || event.keyboard.unichar == 'W') {
            lock_flags = toggle_writeonly(lock_flags);
            redraw = true;
         }
      }
      else if (event.type == ALLEGRO_EVENT_MOUSE_BUTTON_DOWN) {
         if (event.mouse.button == 1) {
            if (event.mouse.x < al_get_display_width(display) / 2) {
               mode = cycle_mode(mode);
            }
            else {
               lock_flags = toggle_writeonly(lock_flags);
            }
            redraw = true;
         }
      }
   }

   close_log(false);
   return 0;
}